

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.hh
# Opt level: O2

bool Funcdata::compareCallspecs(FuncCallSpecs *a,FuncCallSpecs *b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (b->op->parent->super_FlowBlock).index;
  iVar2 = (a->op->parent->super_FlowBlock).index;
  if (iVar2 == iVar1) {
    return (a->op->start).order < (b->op->start).order;
  }
  return iVar2 < iVar1;
}

Assistant:

PcodeOp *getOp(void) const { return op; }